

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O1

void rw::conv_ARGB1555_from_RGBA5551(uint8 *out,uint8 *in)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  
  bVar1 = *in;
  bVar3 = bVar1 >> 1;
  bVar2 = in[1];
  *out = bVar3 & 0xe0 | bVar2 << 7 | bVar3 & 0x1f;
  out[1] = bVar1 << 7 | bVar2 >> 1;
  return;
}

Assistant:

void
conv_ARGB1555_from_RGBA5551(uint8 *out, uint8 *in)
{
	uint32 r, g, b, a;
	a = in[0] & 1;
	b = (in[0]>>1) & 0x1F;
	g = (in[1]&7)<<2 | ((in[0]>>6)&3);
	r = (in[1]>>3) & 0x1F;
	out[0] = b | g<<5;
	out[1] = g>>3 | r<<2 | a<<7;
}